

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O0

Var Js::JavascriptError::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  ScriptContext *pSVar6;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  JavascriptLibrary *pJVar10;
  JavascriptString *pJVar11;
  charcount_t msgLen;
  charcount_t nameLen;
  BOOL hasName;
  JavascriptString *message;
  JavascriptString *outputStr;
  Var value;
  RecyclableObject *thisError;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_34;
  TypeId local_28;
  TypeId typeId;
  TypeId typeId_1;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar6,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xbc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  thisError = (RecyclableObject *)RecyclableObject::GetScriptContext(function);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xbf,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xc1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
  if (pvVar8 == (Var)0x0) {
LAB_0113348b:
    ThrowTypeError((ScriptContext *)thisError,-0x7ff5ec41,L"Error.prototype.toString");
  }
  pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
  BVar3 = Js::JavascriptOperators::IsObject(pvVar8);
  if (BVar3 == 0) goto LAB_0113348b;
  pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
  value = VarTo<Js::RecyclableObject>(pvVar8);
  outputStr = (JavascriptString *)0x0;
  BVar3 = Js::JavascriptOperators::GetPropertyNoCache
                    ((RecyclableObject *)value,0x106,&outputStr,(ScriptContext *)thisError);
  pJVar11 = outputStr;
  bVar2 = false;
  if (BVar3 != 0) {
    if (outputStr == (JavascriptString *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar2 = TaggedInt::Is(pJVar11);
    if (bVar2) {
      local_28 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pJVar11);
      if (bVar2) {
        local_28 = TypeIds_Number;
      }
      else {
        pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pJVar11);
        if (pRVar9 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        local_28 = RecyclableObject::GetTypeId(pRVar9);
        if ((0x57 < (int)local_28) && (BVar3 = RecyclableObject::IsExternal(pRVar9), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
    }
    bVar2 = local_28 != TypeIds_Undefined;
  }
  if (bVar2) {
    message = JavascriptConversion::ToString(outputStr,(ScriptContext *)thisError);
  }
  else {
    pJVar10 = ScriptContext::GetLibrary((ScriptContext *)thisError);
    message = JavascriptLibrary::CreateStringFromCppLiteral<6ul>(pJVar10,(char16 (*) [6])0x195d70e);
  }
  BVar3 = Js::JavascriptOperators::GetPropertyNoCache
                    ((RecyclableObject *)value,0x102,&outputStr,(ScriptContext *)thisError);
  if (BVar3 != 0) {
    callInfo_local = (CallInfo)outputStr;
    if (outputStr == (JavascriptString *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar2 = TaggedInt::Is((Var)callInfo_local);
    if (bVar2) {
      local_34 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck((Var)callInfo_local);
      if (bVar2) {
        local_34 = TypeIds_Number;
      }
      else {
        pRVar9 = UnsafeVarTo<Js::RecyclableObject>((Var)callInfo_local);
        if (pRVar9 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        local_34 = RecyclableObject::GetTypeId(pRVar9);
        if ((0x57 < (int)local_34) && (BVar3 = RecyclableObject::IsExternal(pRVar9), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
    }
    if (local_34 != TypeIds_Undefined) {
      _nameLen = JavascriptConversion::ToString(outputStr,(ScriptContext *)thisError);
      goto LAB_0113392c;
    }
  }
  pJVar10 = ScriptContext::GetLibrary((ScriptContext *)thisError);
  _nameLen = JavascriptLibrary::GetEmptyString(pJVar10);
LAB_0113392c:
  cVar4 = JavascriptString::GetLength(message);
  cVar5 = JavascriptString::GetLength(_nameLen);
  if ((cVar4 == 0) || (cVar5 == 0)) {
    if (cVar5 != 0) {
      message = _nameLen;
    }
  }
  else {
    pJVar10 = ScriptContext::GetLibrary((ScriptContext *)thisError);
    pJVar11 = JavascriptLibrary::CreateStringFromCppLiteral<3ul>(pJVar10,(char16 (*) [3])0x181b01a);
    pJVar11 = JavascriptString::Concat(message,pJVar11);
    message = JavascriptString::Concat(pJVar11,_nameLen);
  }
  return message;
}

Assistant:

Var JavascriptError::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args[0] == 0 || !JavascriptOperators::IsObject(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Error.prototype.toString"));
        }

        RecyclableObject* thisError = VarTo<RecyclableObject>(args[0]);
        Var value = NULL;
        JavascriptString *outputStr, *message;

        // get error.name
        BOOL hasName = JavascriptOperators::GetPropertyNoCache(thisError, PropertyIds::name, &value, scriptContext) &&
            JavascriptOperators::GetTypeId(value) != TypeIds_Undefined;

        if (hasName)
        {
            outputStr = JavascriptConversion::ToString(value, scriptContext);
        }
        else
        {
            outputStr = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("Error"));
        }

        // get error.message
        if (JavascriptOperators::GetPropertyNoCache(thisError, PropertyIds::message, &value, scriptContext)
            && JavascriptOperators::GetTypeId(value) != TypeIds_Undefined)
        {
            message = JavascriptConversion::ToString(value, scriptContext);
        }
        else
        {
            message = scriptContext->GetLibrary()->GetEmptyString();
        }

        charcount_t nameLen = outputStr->GetLength();
        charcount_t msgLen = message->GetLength();

        if (nameLen > 0 && msgLen > 0)
        {
            outputStr = JavascriptString::Concat(outputStr, scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u(": ")));
            outputStr = JavascriptString::Concat(outputStr, message);
        }
        else if (msgLen > 0)
        {
            outputStr = message;
        }

        return outputStr;
    }